

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

int __thiscall cmCTestSubmitHandler::GetSubmitInactivityTimeout(cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar3;
  int iVar4;
  unsigned_long timeout;
  ostringstream cmCTestLog_msg;
  int local_1d8 [2];
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1d0;
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_190._0_8_ = local_190 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"SubmitInactivityTimeout","");
  cmCTest::GetCTestConfiguration((string *)(local_1c0 + 0x10),pcVar1,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (local_1c0._24_8_ != 0) {
    bVar2 = cmStrToULong((string *)(local_1c0 + 0x10),(unsigned_long *)local_1d8);
    iVar4 = local_1d8[0];
    if (bVar2) goto LAB_00592407;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"SubmitInactivityTimeout is invalid: ",0x24);
    local_1d0._M_delim = '\"';
    local_1d0._M_escape = '\\';
    local_1d0._M_string = (string *)(local_1c0 + 0x10);
    this_00 = std::__detail::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)local_190,&local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,".",1);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," Using a default value of ",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x394,(char *)local_1d0._M_string,false);
    if (local_1d0._M_string != (string *)local_1c0) {
      operator_delete(local_1d0._M_string,(ulong)(local_1c0._0_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  iVar4 = 0x78;
LAB_00592407:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._16_8_ != &local_1a0) {
    operator_delete((void *)local_1c0._16_8_,local_1a0._M_allocated_capacity + 1);
  }
  return iVar4;
}

Assistant:

int cmCTestSubmitHandler::GetSubmitInactivityTimeout()
{
  int submitInactivityTimeout = SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT;
  std::string const& timeoutStr =
    this->CTest->GetCTestConfiguration("SubmitInactivityTimeout");
  if (!timeoutStr.empty()) {
    unsigned long timeout;
    if (cmStrToULong(timeoutStr, &timeout)) {
      submitInactivityTimeout = static_cast<int>(timeout);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "SubmitInactivityTimeout is invalid: "
                   << cm::quoted(timeoutStr) << "."
                   << " Using a default value of "
                   << SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT << "." << std::endl);
    }
  }
  return submitInactivityTimeout;
}